

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

bool nonsugar::detail::starts_with<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s2)

{
  ulong uVar1;
  ulong uVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first2;
  undefined1 local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s2_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1_local;
  
  uVar1 = std::__cxx11::string::size();
  uVar2 = std::__cxx11::string::size();
  local_31 = false;
  if (uVar2 <= uVar1) {
    __first1._M_current = (char *)std::__cxx11::string::begin();
    __last1._M_current = (char *)std::__cxx11::string::end();
    __first2._M_current = (char *)std::__cxx11::string::begin();
    local_31 = std::
               equal<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         (__first1,__last1,__first2);
  }
  return local_31;
}

Assistant:

inline bool starts_with(String const &s1, String const &s2)
{
    return s1.size() >= s2.size() && std::equal(s2.begin(), s2.end(), s1.begin());
}